

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O0

U64 MEM_swap64(U64 in)

{
  U64 in_local;
  
  return in >> 0x38 | (in & 0xff000000000000) >> 0x28 | (in & 0xff0000000000) >> 0x18 |
         (in & 0xff00000000) >> 8 | (in & 0xff000000) << 8 | (in & 0xff0000) << 0x18 |
         (in & 0xff00) << 0x28 | in << 0x38;
}

Assistant:

MEM_STATIC U64 MEM_swap64(U64 in)
{
#if defined(_MSC_VER)     /* Visual Studio */
    return _byteswap_uint64(in);
#elif (defined (__GNUC__) && (__GNUC__ * 100 + __GNUC_MINOR__ >= 403)) \
  || (defined(__clang__) && __has_builtin(__builtin_bswap64))
    return __builtin_bswap64(in);
#else
    return MEM_swap64_fallback(in);
#endif
}